

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_subscribe(Curl_easy *data)

{
  int iVar1;
  void *pvVar2;
  size_t __n;
  mqtt_conn *mqtt;
  connectdata *conn;
  size_t n;
  uchar *puStack_40;
  char encodedsize [4];
  size_t packetlen;
  uchar *packet;
  size_t topiclen;
  char *topic;
  Curl_easy *pCStack_18;
  CURLcode result;
  Curl_easy *data_local;
  
  topic._4_4_ = 0;
  topiclen = 0;
  packetlen = 0;
  pCStack_18 = data;
  pvVar2 = Curl_conn_meta_get(data->conn,"meta:proto:mqtt:conn");
  if (pvVar2 == (void *)0x0) {
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    topic._4_4_ = mqtt_get_topic(pCStack_18,(char **)&topiclen,(size_t *)&packet);
    if (topic._4_4_ == CURLE_OK) {
      *(int *)((long)pvVar2 + 8) = *(int *)((long)pvVar2 + 8) + 1;
      puStack_40 = packet + 5;
      iVar1 = mqtt_encode_len((char *)((long)&n + 4),(size_t)puStack_40);
      __n = (size_t)iVar1;
      puStack_40 = puStack_40 + __n + 1;
      packetlen = (size_t)(*Curl_cmalloc)((size_t)puStack_40);
      if ((char *)packetlen == (char *)0x0) {
        topic._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        *(char *)packetlen = -0x7e;
        memcpy((char *)(packetlen + 1),(void *)((long)&n + 4),__n);
        *(char *)(packetlen + __n + 1) = (char)((uint)*(undefined4 *)((long)pvVar2 + 8) >> 8);
        *(char *)(packetlen + __n + 2) = (char)*(undefined4 *)((long)pvVar2 + 8);
        *(char *)(packetlen + __n + 3) = (char)((ulong)packet >> 8);
        *(char *)(packetlen + __n + 4) = (char)packet;
        memcpy((char *)(packetlen + __n + 5),(void *)topiclen,(size_t)packet);
        *(char *)(packetlen + (long)(packet + __n + 5)) = '\0';
        topic._4_4_ = mqtt_send(pCStack_18,(char *)packetlen,(size_t)puStack_40);
      }
    }
    (*Curl_cfree)((void *)topiclen);
    (*Curl_cfree)((void *)packetlen);
    data_local._4_4_ = topic._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode mqtt_subscribe(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  char *topic = NULL;
  size_t topiclen;
  unsigned char *packet = NULL;
  size_t packetlen;
  char encodedsize[4];
  size_t n;
  struct connectdata *conn = data->conn;
  struct mqtt_conn *mqtt = Curl_conn_meta_get(conn, CURL_META_MQTT_CONN);

  if(!mqtt)
    return CURLE_FAILED_INIT;

  result = mqtt_get_topic(data, &topic, &topiclen);
  if(result)
    goto fail;

  mqtt->packetid++;

  packetlen = topiclen + 5; /* packetid + topic (has a two byte length field)
                               + 2 bytes topic length + QoS byte */
  n = mqtt_encode_len((char *)encodedsize, packetlen);
  packetlen += n + 1; /* add one for the control packet type byte */

  packet = malloc(packetlen);
  if(!packet) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  packet[0] = MQTT_MSG_SUBSCRIBE;
  memcpy(&packet[1], encodedsize, n);
  packet[1 + n] = (mqtt->packetid >> 8) & 0xff;
  packet[2 + n] = mqtt->packetid & 0xff;
  packet[3 + n] = (topiclen >> 8) & 0xff;
  packet[4 + n ] = topiclen & 0xff;
  memcpy(&packet[5 + n], topic, topiclen);
  packet[5 + n + topiclen] = 0; /* QoS zero */

  result = mqtt_send(data, (const char *)packet, packetlen);

fail:
  free(topic);
  free(packet);
  return result;
}